

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O0

void __thiscall CEPlanet::init_members(CEPlanet *this)

{
  allocator_type *in_RDI;
  vector<double,_std::allocator<double>_> *this_00;
  size_type in_stack_ffffffffffffff98;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa0;
  vector<double,_std::allocator<double>_> *this_01;
  vector<double,_std::allocator<double>_> local_29;
  
  *(undefined8 *)(in_RDI + 0x50) = 0;
  *(undefined8 *)(in_RDI + 0x58) = 0;
  *(undefined8 *)(in_RDI + 0x60) = 0;
  *(undefined8 *)(in_RDI + 0x68) = 0;
  *(undefined4 *)(in_RDI + 0x70) = 0;
  *(undefined8 *)(in_RDI + 0x78) = 0;
  *(undefined8 *)(in_RDI + 0x80) = 0xc6293e5939a08cea;
  local_29.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._1_8_
       = 0;
  this_00 = &local_29;
  std::allocator<double>::allocator((allocator<double> *)0x139304);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(value_type *)this_00,in_RDI);
  std::vector<double,_std::allocator<double>_>::operator=
            (this_00,(vector<double,_std::allocator<double>_> *)in_RDI);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::allocator<double>::~allocator((allocator<double> *)0x13934c);
  this_01 = (vector<double,_std::allocator<double>_> *)0x0;
  std::allocator<double>::allocator((allocator<double> *)0x139364);
  std::vector<double,_std::allocator<double>_>::vector
            (this_01,in_stack_ffffffffffffff98,(value_type *)this_00,in_RDI);
  std::vector<double,_std::allocator<double>_>::operator=
            (this_00,(vector<double,_std::allocator<double>_> *)in_RDI);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::allocator<double>::~allocator((allocator<double> *)0x1393a9);
  *(undefined8 *)(in_RDI + 0xb8) = 0;
  *(undefined8 *)(in_RDI + 0xc0) = 0;
  *(undefined8 *)(in_RDI + 200) = 0;
  *(undefined8 *)(in_RDI + 0xd0) = 0;
  *(undefined8 *)(in_RDI + 0xd8) = 0;
  *(undefined8 *)(in_RDI + 0xe0) = 0;
  *(undefined8 *)(in_RDI + 0xe8) = 0;
  *(undefined8 *)(in_RDI + 0xf0) = 0;
  *(undefined8 *)(in_RDI + 0xf8) = 0;
  *(undefined8 *)(in_RDI + 0x100) = 0;
  *(undefined8 *)(in_RDI + 0x108) = 0;
  *(undefined8 *)(in_RDI + 0x110) = 0;
  *(undefined8 *)(in_RDI + 0x118) = 0x3eb0c6f7a0b5ed8d;
  *(undefined8 *)(in_RDI + 0x120) = 0;
  *(undefined8 *)(in_RDI + 0x128) = 0;
  *(undefined8 *)(in_RDI + 0x130) = 0;
  *(undefined8 *)(in_RDI + 0x138) = 0;
  return;
}

Assistant:

void CEPlanet::init_members(void)
{
    // Basic properties
    radius_m_ = 0.0;
    mass_kg_  = 0.0;
    albedo_   = 0.0;
    
    // The following is a reference point for the observer
    // This will almost always be the Earth-Moon barycenter
    reference_ = nullptr;//new CEPlanet(CEPlanet::EMBarycenter());
    
    // Define the algorithm used to compute the planets position
    algorithm_type_ = CEPlanetAlgo::SOFA;
    // Sofa planet id (note: 3.5 implies the earth-center which uses a different method
    // than the other planets)
    sofa_planet_id_ = 0;
    
    // The coordinates representing the current position will need to be
    // relative to some date, since planets move. This is the cached date
    cached_jd_ = -1.0e30;
    pos_icrs_ = std::vector<double>(3, 0.0);
    // Note, these velocities are only computed for "algorithm_type_=SOFA" at the moment
    vel_icrs_ = std::vector<double>(3, 0.0);
    
    /******************************************
     * Properties for the JPL algorithm
     ******************************************/
    // Orbital properties (element 2 is the derivative)
    semi_major_axis_au_     = 0.0;
    eccentricity_           = 0.0;
    inclination_deg_        = 0.0;
    mean_longitude_deg_     = 0.0;
    perihelion_lon_deg_     = 0.0;
    ascending_node_lon_deg_ = 0.0;
    
    // Derivatives of orbital properties
    semi_major_axis_au_per_cent_     = 0.0;
    eccentricity_per_cent_           = 0.0;
    inclination_deg_per_cent_        = 0.0;
    mean_longitude_deg_per_cent_     = 0.0;
    perihelion_long_deg_per_cent_    = 0.0;
    ascending_node_lon_deg_per_cent_ = 0.0;
    
    // The following is the tolerance for the computation of eccentric anomoly
    E_tol = 1.0e-6;
    
    // Extra terms for outer planets (Jupiter, Saturn, Uranus, Neptune, and Pluto)
    b_ = 0.0;
    c_ = 0.0;
    s_ = 0.0;
    f_ = 0.0;
}